

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derTSEQDecStop(octet *der,der_anchor_t *anchor)

{
  octet *poVar1;
  ulong uVar2;
  bool bVar3;
  bool_t bVar4;
  long lVar5;
  long lVar6;
  u32 tag;
  ulong uVar7;
  
  poVar1 = anchor->der;
  tag = anchor->tag;
  bVar4 = derTIsValid(tag);
  if (bVar4 == 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = 0;
    if (tag != 0) {
      do {
        lVar5 = lVar5 + 1;
        bVar3 = 0xff < tag;
        tag = tag >> 8;
      } while (bVar3);
    }
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
  }
  uVar2 = anchor->len;
  lVar6 = 1;
  uVar7 = uVar2;
  if (0x7f < uVar2) {
    do {
      lVar6 = lVar6 + 1;
      bVar3 = 0xff < uVar7;
      uVar7 = uVar7 >> 8;
    } while (bVar3);
  }
  return -(ulong)(poVar1 + lVar6 + lVar5 + uVar2 != der || der < poVar1 + lVar6 + lVar5);
}

Assistant:

size_t derTSEQDecStop(const octet der[], const der_anchor_t* anchor)
{
	const octet* val;
	ASSERT(memIsValid(anchor, sizeof(der_anchor_t)));
	// определить начало вложенных данных
	val = anchor->der + derTEnc(0, anchor->tag) + derLEnc(0, anchor->len);
	if (val > der)
		return SIZE_MAX;
	// сравнить длину вложенных данных с сохраненной длиной
	return (der == val + anchor->len) ? 0 : SIZE_MAX;
}